

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_bds.cpp
# Opt level: O1

void BDS::ComputeSyncAofs
               (MultiFab *aofs,int aofs_comp,int ncomp,MultiFab *state,int state_comp,MultiFab *umac
               ,MultiFab *vmac,MultiFab *wmac,MultiFab *ucorr,MultiFab *vcorr,MultiFab *wcorr,
               MultiFab *xedge,MultiFab *yedge,MultiFab *zedge,int edge_comp,bool known_edgestate,
               MultiFab *xfluxes,MultiFab *yfluxes,MultiFab *zfluxes,int fluxes_comp,MultiFab *fq,
               int fq_comp,MultiFab *divu,BCRec *d_bc,Geometry *geom,DeviceVector<int> *iconserv,
               Real dt,bool is_velocity)

{
  int *piVar1;
  Geometry geom_00;
  ulong uVar2;
  int i;
  DataAllocator arena;
  long lVar3;
  int iVar4;
  Geometry *pGVar5;
  undefined8 *puVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  byte bVar13;
  undefined1 auVar14 [88];
  undefined1 auVar15 [48];
  undefined1 in_stack_fffffffffffff9f0 [160];
  undefined1 auVar16 [24];
  undefined8 in_stack_fffffffffffffa90;
  Array4<const_double> *in_stack_fffffffffffffa98;
  Array4<double> *in_stack_fffffffffffffaa0;
  Array4<const_double> *in_stack_fffffffffffffaa8;
  Array4<const_double> *in_stack_fffffffffffffab0;
  long local_518;
  Box local_504;
  long local_4e8;
  long local_4e0;
  Array4<const_double> local_4d8;
  Array4<const_double> local_498;
  pointer local_458;
  FabArray<amrex::FArrayBox> *local_450;
  FabArray<amrex::FArrayBox> *local_448;
  Real local_440;
  ulong local_438;
  FabArray<amrex::FArrayBox> *local_430;
  ulong local_428;
  long local_420;
  long local_418;
  ulong local_410;
  long local_408;
  long local_400;
  Array4<const_double> local_3f8;
  FArrayBox tmpfab;
  Array4<const_double> local_370;
  Elixir eli;
  Box tmpbox;
  Array4<double> local_2d0;
  Array4<double> local_290;
  Array4<double> local_250;
  Array4<double> local_210;
  Array4<double> local_1d0;
  Array4<double> local_190;
  MFIter mfi;
  Array4<const_double> local_f0;
  Array4<const_double> local_b0;
  Array4<const_double> local_70;
  
  bVar13 = 0;
  local_458 = iconserv->m_data;
  local_450 = &state->super_FabArray<amrex::FArrayBox>;
  local_448 = &umac->super_FabArray<amrex::FArrayBox>;
  local_440 = dt;
  local_430 = &aofs->super_FabArray<amrex::FArrayBox>;
  amrex::MFIter::MFIter(&mfi,(FabArrayBase *)aofs,true);
  if (mfi.currentIndex < mfi.endIndex) {
    local_438 = (ulong)(uint)ncomp;
    local_428 = (ulong)(uint)ncomp;
    do {
      uVar2 = local_438;
      amrex::MFIter::tilebox(&local_504,&mfi);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_190,&xfluxes->super_FabArray<amrex::FArrayBox>,&mfi,fluxes_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_1d0,&yfluxes->super_FabArray<amrex::FArrayBox>,&mfi,fluxes_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_210,&zfluxes->super_FabArray<amrex::FArrayBox>,&mfi,fluxes_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_250,&xedge->super_FabArray<amrex::FArrayBox>,&mfi,edge_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_290,&yedge->super_FabArray<amrex::FArrayBox>,&mfi,edge_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_2d0,&zedge->super_FabArray<amrex::FArrayBox>,&mfi,edge_comp);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_70,&ucorr->super_FabArray<amrex::FArrayBox>,&mfi);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_b0,&vcorr->super_FabArray<amrex::FArrayBox>,&mfi);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_f0,&wcorr->super_FabArray<amrex::FArrayBox>,&mfi);
      iVar4 = (int)uVar2;
      if (!known_edgestate) {
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)&tmpfab,local_448,&mfi);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_498,&vmac->super_FabArray<amrex::FArrayBox>,&mfi);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_4d8,&wmac->super_FabArray<amrex::FArrayBox>,&mfi);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_3f8,local_450,&mfi,state_comp);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_370,&divu->super_FabArray<amrex::FArrayBox>,&mfi);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)&tmpbox,&fq->super_FabArray<amrex::FArrayBox>,&mfi,
                   fq_comp);
        pGVar5 = geom;
        puVar6 = (undefined8 *)&stack0xfffffffffffff9f0;
        for (lVar3 = 0x19; lVar3 != 0; lVar3 = lVar3 + -1) {
          *puVar6 = *(undefined8 *)&pGVar5->super_CoordSys;
          pGVar5 = (Geometry *)((long)pGVar5 + (ulong)bVar13 * -0x10 + 8);
          puVar6 = puVar6 + (ulong)bVar13 * -2 + 1;
        }
        geom_00.roundoff_hi_f.arr[0] = (float)(int)in_stack_fffffffffffffa90;
        geom_00.roundoff_hi_f.arr[1] = (float)(int)((ulong)in_stack_fffffffffffffa90 >> 0x20);
        auVar14 = in_stack_fffffffffffff9f0._0_88_;
        auVar15 = in_stack_fffffffffffff9f0._88_48_;
        auVar16 = in_stack_fffffffffffff9f0._136_24_;
        geom_00.super_CoordSys.c_sys = auVar14._0_4_;
        geom_00.super_CoordSys._4_4_ = auVar14._4_4_;
        geom_00.super_CoordSys.offset[0] = (Real)auVar14._8_8_;
        geom_00.super_CoordSys.offset[1] = (Real)auVar14._16_8_;
        geom_00.super_CoordSys.offset[2] = (Real)auVar14._24_8_;
        geom_00.super_CoordSys.dx[0] = (Real)auVar14._32_8_;
        geom_00.super_CoordSys.dx[1] = (Real)auVar14._40_8_;
        geom_00.super_CoordSys.dx[2] = (Real)auVar14._48_8_;
        geom_00.super_CoordSys.inv_dx[0] = (Real)auVar14._56_8_;
        geom_00.super_CoordSys.inv_dx[1] = (Real)auVar14._64_8_;
        geom_00.super_CoordSys.inv_dx[2] = (Real)auVar14._72_8_;
        geom_00.super_CoordSys.ok = (bool)auVar14[0x50];
        geom_00.super_CoordSys._81_7_ = auVar14._81_7_;
        geom_00.prob_domain.xlo[0] = (Real)auVar15._0_8_;
        geom_00.prob_domain.xlo[1] = (Real)auVar15._8_8_;
        geom_00.prob_domain.xlo[2] = (Real)auVar15._16_8_;
        geom_00.prob_domain.xhi[0] = (Real)auVar15._24_8_;
        geom_00.prob_domain.xhi[1] = (Real)auVar15._32_8_;
        geom_00.prob_domain.xhi[2] = (Real)auVar15._40_8_;
        geom_00.roundoff_hi_d.arr[0] = (double)auVar16._0_8_;
        geom_00.roundoff_hi_d.arr[1] = (double)auVar16._8_8_;
        geom_00.roundoff_hi_d.arr[2] = (double)auVar16._16_8_;
        geom_00._168_8_ = in_stack_fffffffffffffa98;
        geom_00.domain.smallend.vect._4_8_ = in_stack_fffffffffffffaa0;
        geom_00.domain.bigend.vect._0_8_ = in_stack_fffffffffffffaa8;
        geom_00.domain._20_8_ = in_stack_fffffffffffffab0;
        ComputeEdgeState(&local_504,iVar4,&local_3f8,&local_250,&local_290,&local_2d0,
                         (Array4<const_double> *)&tmpfab,&local_498,&local_4d8,&local_370,
                         (Array4<const_double> *)&tmpbox,geom_00,local_440,d_bc,local_458,
                         is_velocity);
      }
      tmpbox.bigend.vect[2] = local_504.bigend.vect[2];
      lVar3 = 0;
      do {
        if ((local_504.btype.itype >> ((uint)lVar3 & 0x1f) & 1) == 0) {
          piVar1 = tmpbox.bigend.vect + lVar3;
          *piVar1 = *piVar1 + 1;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      tmpbox.btype.itype = 7;
      amrex::FArrayBox::FArrayBox(&tmpfab,&tmpbox,ncomp * 3,true,false,(Arena *)0x0);
      arena = tmpfab.super_BaseFab<double>.super_DataAllocator;
      if (tmpfab.super_BaseFab<double>.super_DataAllocator.m_arena == (Arena *)0x0) {
        arena.m_arena = amrex::The_Arena();
      }
      amrex::Gpu::Elixir::Elixir(&eli,(void *)0x0,arena.m_arena);
      local_498.begin.x = tmpfab.super_BaseFab<double>.domain.smallend.vect[0];
      local_498.begin.y = tmpfab.super_BaseFab<double>.domain.smallend.vect[1];
      local_498.p = tmpfab.super_BaseFab<double>.dptr;
      local_498.jstride =
           ((long)tmpfab.super_BaseFab<double>.domain.bigend.vect[0] -
           (long)tmpfab.super_BaseFab<double>.domain.smallend.vect[0]) + 1;
      local_498.kstride =
           (((long)tmpfab.super_BaseFab<double>.domain.bigend.vect[1] + 1) -
           (long)tmpfab.super_BaseFab<double>.domain.smallend.vect[1]) * local_498.jstride;
      local_498.nstride =
           (((long)tmpfab.super_BaseFab<double>.domain.bigend.vect[2] + 1) -
           (long)tmpfab.super_BaseFab<double>.domain.smallend.vect[2]) * local_498.kstride;
      local_498.begin.z = tmpfab.super_BaseFab<double>.domain.smallend.vect[2];
      local_498.end._0_8_ =
           (long)tmpfab.super_BaseFab<double>.domain.bigend.vect[0] + 1U & 0xffffffff |
           (long)tmpfab.super_BaseFab<double>.domain.bigend.vect[1] + 1 << 0x20;
      local_498.end.z = (int)((long)tmpfab.super_BaseFab<double>.domain.bigend.vect[2] + 1);
      local_498.ncomp = tmpfab.super_BaseFab<double>.nvar;
      local_4d8.p = local_250.p;
      local_4d8.jstride = local_250.jstride;
      local_4d8.kstride = local_250.kstride;
      local_4d8.nstride = local_250.nstride;
      local_4d8.begin.z = local_250.begin.z;
      local_4d8.begin.x = local_250.begin.x;
      local_4d8.begin.y = local_250.begin.y;
      local_4d8.end.z = local_250.end.z;
      local_4d8.end.x = local_250.end.x;
      local_4d8.end.y = local_250.end.y;
      local_4d8.ncomp = local_250.ncomp;
      local_3f8.p = local_290.p;
      local_3f8.jstride = local_290.jstride;
      local_3f8.kstride = local_290.kstride;
      local_3f8.nstride = local_290.nstride;
      local_3f8.begin.z = local_290.begin.z;
      local_3f8.begin.x = local_290.begin.x;
      local_3f8.begin.y = local_290.begin.y;
      local_3f8.end.z = local_290.end.z;
      local_3f8.end.x = local_290.end.x;
      local_3f8.end.y = local_290.end.y;
      local_3f8.ncomp = local_290.ncomp;
      local_370.p = local_2d0.p;
      local_370.jstride = local_2d0.jstride;
      local_370.kstride = local_2d0.kstride;
      local_370.nstride = local_2d0.nstride;
      local_370.begin.z = local_2d0.begin.z;
      local_370.begin.x = local_2d0.begin.x;
      local_370.begin.y = local_2d0.begin.y;
      local_370.end.z = local_2d0.end.z;
      local_370.end.x = local_2d0.end.x;
      local_370.end.y = local_2d0.end.y;
      local_370.ncomp = local_2d0.ncomp;
      in_stack_fffffffffffffaa8 = &local_3f8;
      in_stack_fffffffffffffa98 = &local_f0;
      in_stack_fffffffffffffa90 = 0x3b241e;
      in_stack_fffffffffffffaa0 = (Array4<double> *)&local_4d8;
      in_stack_fffffffffffffab0 = &local_370;
      HydroUtils::ComputeFluxes
                (&local_504,&local_190,&local_1d0,&local_210,&local_70,&local_b0,
                 in_stack_fffffffffffffa98,&local_4d8,in_stack_fffffffffffffaa8,&local_370,geom,
                 iVar4,true);
      local_4d8.p = local_190.p;
      local_4d8.jstride = local_190.jstride;
      local_4d8.kstride = local_190.kstride;
      local_4d8.nstride = local_190.nstride;
      local_4d8.begin.z = local_190.begin.z;
      local_4d8.begin.x = local_190.begin.x;
      local_4d8.begin.y = local_190.begin.y;
      local_4d8.end.z = local_190.end.z;
      local_4d8.end.x = local_190.end.x;
      local_4d8.end.y = local_190.end.y;
      local_4d8.ncomp = local_190.ncomp;
      local_3f8.p = local_1d0.p;
      local_3f8.jstride = local_1d0.jstride;
      local_3f8.kstride = local_1d0.kstride;
      local_3f8.nstride = local_1d0.nstride;
      local_3f8.begin.z = local_1d0.begin.z;
      local_3f8.begin.x = local_1d0.begin.x;
      local_3f8.begin.y = local_1d0.begin.y;
      local_3f8.end.z = local_1d0.end.z;
      local_3f8.end.x = local_1d0.end.x;
      local_3f8.end.y = local_1d0.end.y;
      local_3f8.ncomp = local_1d0.ncomp;
      local_370.p = local_210.p;
      local_370.jstride = local_210.jstride;
      local_370.kstride = local_210.kstride;
      local_370.nstride = local_210.nstride;
      local_370.begin.z = local_210.begin.z;
      local_370.begin.x = local_210.begin.x;
      local_370.begin.y = local_210.begin.y;
      local_370.end.z = local_210.end.z;
      local_370.end.x = local_210.end.x;
      local_370.end.y = local_210.end.y;
      local_370.ncomp = local_210.ncomp;
      HydroUtils::ComputeDivergence
                (&local_504,(Array4<double> *)&local_498,&local_4d8,&local_3f8,&local_370,iVar4,geom
                 ,-1.0,true);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)&local_4d8,local_430,&mfi,aofs_comp);
      if (0 < iVar4) {
        lVar3 = (long)local_504.smallend.vect[1];
        local_518 = (lVar3 - local_4d8.begin.y) * local_4d8.jstride * 8 +
                    (long)local_504.smallend.vect[0] * 8 + (long)local_4d8.begin.x * -8 +
                    (long)local_4d8.p;
        local_418 = local_4d8.nstride * 8;
        local_400 = local_4d8.kstride * 8;
        lVar9 = (lVar3 - local_498.begin.y) * local_498.jstride * 8 +
                (long)local_504.smallend.vect[0] * 8 + (long)local_498.begin.x * -8 +
                (long)local_498.p;
        local_408 = -(long)local_4d8.begin.z;
        local_420 = local_498.nstride * 8;
        local_4e0 = local_498.kstride * 8;
        local_4e8 = -(long)local_498.begin.z;
        uVar2 = 0;
        do {
          local_410 = uVar2;
          iVar4 = local_504.smallend.vect[2];
          if (local_504.smallend.vect[2] <= local_504.bigend.vect[2]) {
            do {
              if (local_504.smallend.vect[1] <= local_504.bigend.vect[1]) {
                lVar8 = (local_408 + iVar4) * local_400 + local_518;
                lVar7 = (iVar4 + local_4e8) * local_4e0 + lVar9;
                lVar11 = lVar3;
                do {
                  if (local_504.smallend.vect[0] <= local_504.bigend.vect[0]) {
                    lVar10 = 0;
                    do {
                      *(double *)(lVar8 + lVar10 * 8) =
                           *(double *)(lVar8 + lVar10 * 8) - *(double *)(lVar7 + lVar10 * 8);
                      lVar10 = lVar10 + 1;
                    } while ((local_504.bigend.vect[0] - local_504.smallend.vect[0]) + 1 !=
                             (int)lVar10);
                  }
                  lVar11 = lVar11 + 1;
                  lVar8 = lVar8 + local_4d8.jstride * 8;
                  lVar7 = lVar7 + local_498.jstride * 8;
                } while (local_504.bigend.vect[1] + 1 != (int)lVar11);
              }
              bVar12 = iVar4 != local_504.bigend.vect[2];
              iVar4 = iVar4 + 1;
            } while (bVar12);
          }
          local_518 = local_518 + local_418;
          lVar9 = lVar9 + local_420;
          uVar2 = local_410 + 1;
        } while (local_410 + 1 != local_428);
      }
      amrex::Gpu::Device::streamSynchronize();
      amrex::Gpu::Elixir::~Elixir(&eli);
      tmpfab.super_BaseFab<double>._vptr_BaseFab = (_func_int **)&PTR__BaseFab_00837b90;
      amrex::BaseFab<double>::clear(&tmpfab.super_BaseFab<double>);
      amrex::MFIter::operator++(&mfi);
    } while (mfi.currentIndex < mfi.endIndex);
  }
  amrex::MFIter::~MFIter(&mfi);
  return;
}

Assistant:

void
BDS::ComputeSyncAofs ( MultiFab& aofs,
                       const int aofs_comp,
                       const int ncomp,
                       MultiFab const& state,
                       const int state_comp,
                       AMREX_D_DECL( MultiFab const& umac,
                                     MultiFab const& vmac,
                                     MultiFab const& wmac),
                       AMREX_D_DECL( MultiFab const& ucorr,
                                     MultiFab const& vcorr,
                                     MultiFab const& wcorr),
                       AMREX_D_DECL( MultiFab& xedge,
                                     MultiFab& yedge,
                                     MultiFab& zedge),
                       const int  edge_comp,
                       const bool known_edgestate,
                       AMREX_D_DECL( MultiFab& xfluxes,
                                     MultiFab& yfluxes,
                                     MultiFab& zfluxes),
                       int fluxes_comp,
                       MultiFab const& fq,
                       const int fq_comp,
                       MultiFab const& divu,
                       BCRec const* d_bc,
                       Geometry const& geom,
                       Gpu::DeviceVector<int>& iconserv,
                       const Real dt,
                       const bool is_velocity)
{

    BL_PROFILE("BDS::ComputeSyncAofs()");
    amrex::ignore_unused(divu);

    bool fluxes_are_area_weighted = true;

    int const* iconserv_ptr = iconserv.data();

#if (AMREX_SPACEDIM==2)
    if ( geom.IsRZ() )
    {
        Abort("BDS does not currently support cylindrical coordinates");
    }
#endif

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(aofs,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {

        const Box& bx   = mfi.tilebox();

        //
        // Get handlers to Array4
        //
        AMREX_D_TERM( const auto& fx = xfluxes.array(mfi,fluxes_comp);,
                      const auto& fy = yfluxes.array(mfi,fluxes_comp);,
                      const auto& fz = zfluxes.array(mfi,fluxes_comp););

        AMREX_D_TERM( const auto& xed = xedge.array(mfi,edge_comp);,
                      const auto& yed = yedge.array(mfi,edge_comp);,
                      const auto& zed = zedge.array(mfi,edge_comp););

        AMREX_D_TERM( const auto& uc = ucorr.const_array(mfi);,
                      const auto& vc = vcorr.const_array(mfi);,
                      const auto& wc = wcorr.const_array(mfi););

        if ( !known_edgestate ) {

            AMREX_D_TERM( const auto& u = umac.const_array(mfi);,
                          const auto& v = vmac.const_array(mfi);,
                          const auto& w = wmac.const_array(mfi););

            BDS::ComputeEdgeState( bx, ncomp,
                                   state.array(mfi, state_comp),
                                   AMREX_D_DECL(xed,yed,zed),
                                   AMREX_D_DECL(u,v,w),
                                   divu.array(mfi),
                                   fq.array(mfi,fq_comp),
                                   geom, dt, d_bc, iconserv_ptr,
                                   is_velocity);
        }

        // Temporary divergence
        Box tmpbox = amrex::surroundingNodes(bx);
        int tmpcomp = ncomp*AMREX_SPACEDIM;
        FArrayBox tmpfab(tmpbox, tmpcomp);
        Elixir eli = tmpfab.elixir();
        Array4<Real> divtmp_arr = tmpfab.array();

        Real mult = -1.0;

        HydroUtils::ComputeFluxes( bx,
                                   AMREX_D_DECL( fx, fy, fz ),
                                   AMREX_D_DECL( uc, vc, wc ),
                                   AMREX_D_DECL( xed, yed, zed ),
                                   geom, ncomp, fluxes_are_area_weighted );

        HydroUtils::ComputeDivergence( bx, divtmp_arr,
                                       AMREX_D_DECL( fx, fy, fz ),
                                       ncomp, geom,
                                       mult, fluxes_are_area_weighted);

        // Sum contribution to sync aofs
        auto const& aofs_arr = aofs.array(mfi, aofs_comp);

        amrex::ParallelFor(bx, ncomp, [aofs_arr, divtmp_arr]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        { aofs_arr( i, j, k, n ) += - divtmp_arr( i, j, k, n ); });

        Gpu::streamSynchronize();  // otherwise we might be using too much memory
    }

}